

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_monster(parser *p)

{
  wchar_t wVar1;
  char *pcVar2;
  monster_race *pmVar3;
  parser_error pVar4;
  
  pcVar2 = (char *)parser_priv(p);
  if (pcVar2 != (char *)0x0) {
    pVar4 = PARSE_ERROR_NONE;
    if (*pcVar2 == '\0') {
      pcVar2 = parser_getsym(p,"name");
      pmVar3 = lookup_monster(pcVar2);
      if (pmVar3 == (monster_race *)0x0) {
        pVar4 = PARSE_ERROR_NO_KIND_FOUND;
      }
      else {
        wVar1 = parser_getint(p,"attr");
        monster_x_attr[pmVar3->ridx] = (uint8_t)wVar1;
        wVar1 = parser_getint(p,"char");
        monster_x_char[pmVar3->ridx] = wVar1;
        pVar4 = PARSE_ERROR_NONE;
      }
    }
    return pVar4;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x2b0,"enum parser_error parse_prefs_monster(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_monster(struct parser *p)
{
	const char *name;
	struct monster_race *monster;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	monster = lookup_monster(name);
	if (!monster)
		return PARSE_ERROR_NO_KIND_FOUND;

	monster_x_attr[monster->ridx] = (uint8_t)parser_getint(p, "attr");
	monster_x_char[monster->ridx] = (wchar_t)parser_getint(p, "char");

	return PARSE_ERROR_NONE;
}